

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O2

void __thiscall pixels::fillDead(pixels *this)

{
  pointer puVar1;
  pointer pfVar2;
  pointer puVar3;
  int y;
  int iVar4;
  int x;
  int iVar5;
  long lVar6;
  long lVar7;
  
  for (iVar4 = 0; iVar4 < this->_h; iVar4 = iVar4 + 1) {
    puVar1 = (this->i).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar2 = (this->f).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (this->h).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (iVar5 = 0; iVar5 < this->_w; iVar5 = iVar5 + 1) {
      lVar6 = (long)(this->_stride_x * iVar4 + iVar5);
      puVar1[lVar6] = 0xdeadbeef;
      pfVar2[lVar6] = -6.2598534e+18;
      puVar3[lVar6] = 0xdead;
      for (lVar7 = 0; lVar7 != 0x60; lVar7 = lVar7 + 0x18) {
        *(undefined2 *)
         (*(long *)((long)&this->rgba[0].
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start + lVar7) + lVar6 * 2) = 0xdead;
      }
    }
  }
  return;
}

Assistant:

void fillDead ()
    {
        for (int y = 0; y < _h; ++y)
        {
            for (int x = 0; x < _w; ++x)
            {
                size_t idx = y * _stride_x + x;
                i[idx]     = 0xDEADBEEF;
                union
                {
                    uint32_t iv;
                    float    fv;
                } tmp;
                tmp.iv = 0xDEADBEEF;
                f[idx] = tmp.fv;
                h[idx] = 0xDEAD;
                for (int c = 0; c < 4; ++c)
                    rgba[c][idx] = 0xDEAD;
            }
        }
    }